

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

void __thiscall duckdb::Iterator::FindMinimum(Iterator *this,Node *node)

{
  bool bVar1;
  unsafe_optional_ptr<Node> node_00;
  idx_t i;
  ulong uVar2;
  uint8_t byte;
  Prefix local_40;
  int local_24;
  
  bVar1 = Node::IsAnyLeaf(node);
  if (bVar1) {
    (this->last_leaf).super_IndexPointer.data = (node->super_IndexPointer).data;
  }
  else {
    uVar2 = (node->super_IndexPointer).data;
    if ((long)uVar2 < 0) {
      this->status = GATE_SET;
      this->nested_depth = '\0';
      this->entered_nested_leaf = true;
    }
    if ((uVar2 & 0x7f00000000000000) == 0x100000000000000) {
      Prefix::Prefix(&local_40,this->art,(Node)(node->super_IndexPointer).data,false,false);
      for (uVar2 = 0;
          uVar2 < *(byte *)(CONCAT71(local_40.data._1_7_,(uint8_t)local_40.data) +
                           (ulong)this->art->prefix_count); uVar2 = uVar2 + 1) {
        IteratorKey::Push(&this->current_key,
                          *(uint8_t *)(CONCAT71(local_40.data._1_7_,(uint8_t)local_40.data) + uVar2)
                         );
        if (this->status == GATE_SET) {
          this->row_id[this->nested_depth] =
               *(uint8_t *)(CONCAT71(local_40.data._1_7_,(uint8_t)local_40.data) + uVar2);
          this->nested_depth = this->nested_depth + '\x01';
        }
      }
      local_24 = 0;
      ::std::deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>>::
      emplace_back<duckdb::Node_const&,int>
                ((deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>> *)&this->nodes,
                 node,&local_24);
      node_00.ptr = local_40.ptr;
    }
    else {
      local_40.data._0_1_ = '\0';
      node_00 = GetNextChildInternal<duckdb::Node_const>(this->art,node,(uint8_t *)&local_40);
      IteratorKey::Push(&this->current_key,(uint8_t)local_40.data);
      if (this->status == GATE_SET) {
        this->row_id[this->nested_depth] = (uint8_t)local_40.data;
        this->nested_depth = this->nested_depth + '\x01';
      }
      ::std::deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>>::
      emplace_back<duckdb::Node_const&,unsigned_char&>
                ((deque<duckdb::IteratorEntry,std::allocator<duckdb::IteratorEntry>> *)&this->nodes,
                 node,(uchar *)&local_40);
    }
    FindMinimum(this,node_00.ptr);
  }
  return;
}

Assistant:

void Iterator::FindMinimum(const Node &node) {
	D_ASSERT(node.HasMetadata());

	// Found the minimum.
	if (node.IsAnyLeaf()) {
		last_leaf = node;
		return;
	}

	// We are passing a gate node.
	if (node.GetGateStatus() == GateStatus::GATE_SET) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		status = GateStatus::GATE_SET;
		entered_nested_leaf = true;
		nested_depth = 0;
	}

	// Traverse the prefix.
	if (node.GetType() == NType::PREFIX) {
		Prefix prefix(art, node);
		for (idx_t i = 0; i < prefix.data[Prefix::Count(art)]; i++) {
			current_key.Push(prefix.data[i]);
			if (status == GateStatus::GATE_SET) {
				row_id[nested_depth] = prefix.data[i];
				nested_depth++;
				D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
			}
		}
		nodes.emplace(node, 0);
		return FindMinimum(*prefix.ptr);
	}

	// Go to the leftmost entry in the current node.
	uint8_t byte = 0;
	auto next = node.GetNextChild(art, byte);
	D_ASSERT(next);

	// Recurse on the leftmost node.
	current_key.Push(byte);
	if (status == GateStatus::GATE_SET) {
		row_id[nested_depth] = byte;
		nested_depth++;
		D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
	}
	nodes.emplace(node, byte);
	FindMinimum(*next);
}